

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedJoint.cpp
# Opt level: O1

Transform * __thiscall
iDynTree::FixedJoint::getTransform
          (FixedJoint *this,VectorDynSize *jntPos,LinkIndex child,LinkIndex parent)

{
  Transform *pTVar1;
  
  pTVar1 = &this->link2_X_link1;
  if (this->link1 == child) {
    pTVar1 = &this->link1_X_link2;
  }
  return pTVar1;
}

Assistant:

const Transform & FixedJoint::getTransform(const VectorDynSize & jntPos, const LinkIndex child, const LinkIndex parent) const
{
    if( child == this->link1 )
    {
        return this->link1_X_link2;
    }
    else
    {
        assert(child == this->link2);
        assert(parent == this->link1);
        return this->link2_X_link1;
    }
}